

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_pruneL.h
# Opt level: O3

void __thiscall
Eigen::internal::SparseLUImpl<double,_int>::pruneL
          (SparseLUImpl<double,_int> *this,int jcol,IndexVector *perm_r,int pivrow,int nseg,
          IndexVector *segrep,BlockIndexVector *repfnz,IndexVector *xprune,GlobalLU_t *glu)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  int *piVar14;
  ulong uVar15;
  int *piVar16;
  double *pdVar17;
  ulong uVar18;
  ulong uVar19;
  char *__function;
  long lVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  
  if (-1 < jcol) {
    uVar5 = (glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    if ((long)jcol < (long)uVar5) {
      if (nseg < 1) {
        return;
      }
      piVar6 = (glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      iVar2 = piVar6[jcol];
      piVar7 = (segrep->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      uVar24 = (segrep->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows;
      piVar8 = (xprune->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      lVar9 = (xprune->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      ;
      lVar10 = (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      piVar11 = (glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                m_data;
      piVar12 = (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                m_data;
      uVar19 = 0;
      if ((long)uVar24 < 1) {
        uVar24 = uVar19;
      }
LAB_001506c8:
      if (uVar19 == uVar24) {
LAB_0015092c:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                      ,0xad,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<int, -1, 1>, Level = 0]"
                     );
      }
      iVar3 = piVar7[uVar19];
      lVar20 = (long)iVar3;
      if ((lVar20 < 0) ||
         (*(long *)&(repfnz->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).field_0x8 <= lVar20)) {
        __function = 
        "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<int, -1, 1>>, Level = 1]"
        ;
        goto LAB_00150960;
      }
      if (*(int *)(*(long *)&repfnz->
                             super_RefBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  + lVar20 * 4) != -1) {
        if (((long)uVar5 <= lVar20) || (uVar26 = (ulong)(iVar3 + 1), uVar5 <= uVar26))
        goto LAB_00150915;
        iVar4 = piVar6[lVar20];
        if ((iVar4 != piVar6[uVar26]) && (iVar4 != iVar2)) {
          if ((lVar20 < lVar9) && ((long)uVar26 < lVar10)) {
            iVar21 = piVar12[uVar26];
            if ((iVar21 <= piVar8[lVar20]) && (iVar31 = piVar12[lVar20], iVar31 < iVar21)) {
              lVar28 = (long)iVar31;
              iVar30 = iVar21 + -1;
              piVar13 = (glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data;
              uVar26 = (glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows;
              do {
                if ((iVar31 < 0) || ((long)uVar26 <= lVar28)) goto LAB_00150915;
                if (piVar13[lVar28] == pivrow) {
                  if ((iVar4 < 0) ||
                     ((glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows <= (long)iVar4)) goto LAB_00150915;
                  iVar4 = piVar11[iVar4];
                  piVar14 = (perm_r->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                            m_storage.m_data;
                  uVar15 = (perm_r->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                           m_storage.m_rows;
                  lVar28 = (glu->xlusup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                           .m_storage.m_rows;
                  piVar16 = (glu->xlusup).
                            super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                            m_data;
                  pdVar17 = (glu->lusup).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                            .m_data;
                  uVar18 = (glu->lusup).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows;
                  goto LAB_001507ec;
                }
                lVar28 = lVar28 + 1;
              } while (iVar21 != lVar28);
            }
            goto LAB_001508f0;
          }
          goto LAB_00150915;
        }
      }
      goto LAB_001508f0;
    }
  }
LAB_00150915:
  __function = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
  ;
LAB_00150960:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                ,0x18a,__function);
  while (iVar31 <= iVar30) {
LAB_001507ec:
    if ((iVar30 < 0) || (lVar27 = (long)iVar30, (long)uVar26 <= lVar27)) goto LAB_00150915;
    lVar29 = (long)piVar13[lVar27];
    if ((lVar29 < 0) || ((long)uVar15 <= lVar29)) goto LAB_0015092c;
    if (piVar14[lVar29] == -1) {
LAB_001508d1:
      iVar30 = iVar30 + -1;
    }
    else {
      if ((iVar31 < 0) || (uVar22 = (ulong)iVar31, uVar26 <= uVar22)) goto LAB_00150915;
      iVar21 = piVar13[uVar22];
      uVar23 = (ulong)iVar21;
      if (((long)uVar23 < 0) || (uVar15 <= uVar23)) goto LAB_0015092c;
      if (piVar14[uVar23] == -1) {
        piVar13[uVar22] = piVar13[lVar27];
        piVar13[lVar27] = iVar21;
        if (iVar3 == iVar4) {
          if (lVar28 <= lVar20) goto LAB_00150915;
          iVar21 = piVar16[lVar20];
          iVar25 = (iVar31 - piVar12[lVar20]) + iVar21;
          if ((((iVar25 < 0) || (lVar27 = (long)iVar25, (long)uVar18 <= lVar27)) ||
              (iVar21 = (iVar30 - piVar12[lVar20]) + iVar21, iVar21 < 0)) ||
             (uVar22 = (ulong)iVar21, uVar18 <= uVar22)) {
            __function = 
            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
            ;
            goto LAB_00150960;
          }
          dVar1 = pdVar17[lVar27];
          pdVar17[lVar27] = pdVar17[uVar22];
          pdVar17[uVar22] = dVar1;
        }
        iVar31 = iVar31 + 1;
        goto LAB_001508d1;
      }
      iVar31 = iVar31 + 1;
    }
  }
  piVar8[lVar20] = iVar31;
LAB_001508f0:
  uVar19 = uVar19 + 1;
  if (uVar19 == (uint)nseg) {
    return;
  }
  goto LAB_001506c8;
}

Assistant:

void SparseLUImpl<Scalar,Index>::pruneL(const Index jcol, const IndexVector& perm_r, const Index pivrow, const Index nseg, const IndexVector& segrep, BlockIndexVector repfnz, IndexVector& xprune, GlobalLU_t& glu)
{
  // For each supernode-rep irep in U(*,j]
  Index jsupno = glu.supno(jcol); 
  Index i,irep,irep1; 
  bool movnum, do_prune = false; 
  Index kmin = 0, kmax = 0, minloc, maxloc,krow; 
  for (i = 0; i < nseg; i++)
  {
    irep = segrep(i); 
    irep1 = irep + 1; 
    do_prune = false; 
    
    // Don't prune with a zero U-segment 
    if (repfnz(irep) == emptyIdxLU) continue; 
    
    // If a snode overlaps with the next panel, then the U-segment
    // is fragmented into two parts -- irep and irep1. We should let 
    // pruning occur at the rep-column in irep1s snode. 
    if (glu.supno(irep) == glu.supno(irep1) ) continue; // don't prune 
    
    // If it has not been pruned & it has a nonz in row L(pivrow,i)
    if (glu.supno(irep) != jsupno )
    {
      if ( xprune (irep) >= glu.xlsub(irep1) )
      {
        kmin = glu.xlsub(irep);
        kmax = glu.xlsub(irep1) - 1; 
        for (krow = kmin; krow <= kmax; krow++)
        {
          if (glu.lsub(krow) == pivrow) 
          {
            do_prune = true; 
            break; 
          }
        }
      }
      
      if (do_prune) 
      {
        // do a quicksort-type partition
        // movnum=true means that the num values have to be exchanged
        movnum = false; 
        if (irep == glu.xsup(glu.supno(irep)) ) // Snode of size 1 
          movnum = true; 
        
        while (kmin <= kmax)
        {
          if (perm_r(glu.lsub(kmax)) == emptyIdxLU)
            kmax--; 
          else if ( perm_r(glu.lsub(kmin)) != emptyIdxLU)
            kmin++;
          else 
          {
            // kmin below pivrow (not yet pivoted), and kmax
            // above pivrow: interchange the two suscripts
            std::swap(glu.lsub(kmin), glu.lsub(kmax)); 
            
            // If the supernode has only one column, then we 
            // only keep one set of subscripts. For any subscript
            // intercnahge performed, similar interchange must be 
            // done on the numerical values. 
            if (movnum) 
            {
              minloc = glu.xlusup(irep) + ( kmin - glu.xlsub(irep) ); 
              maxloc = glu.xlusup(irep) + ( kmax - glu.xlsub(irep) ); 
              std::swap(glu.lusup(minloc), glu.lusup(maxloc)); 
            }
            kmin++;
            kmax--;
          }
        } // end while 
        
        xprune(irep) = kmin;  //Pruning 
      } // end if do_prune 
    } // end pruning 
  } // End for each U-segment
}